

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void mbedtls_ssl_write_version(int major,int minor,int transport,uchar *ver)

{
  uchar *ver_local;
  int local_10;
  int transport_local;
  int minor_local;
  int major_local;
  
  if (transport == 1) {
    local_10 = minor;
    if (minor == 2) {
      local_10 = 1;
    }
    *ver = 0xff - ((uchar)major + 0xfe);
    ver[1] = 0xff - ((char)local_10 + -1);
  }
  else {
    *ver = (uchar)major;
    ver[1] = (uchar)minor;
  }
  return;
}

Assistant:

void mbedtls_ssl_write_version( int major, int minor, int transport,
                        unsigned char ver[2] )
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        if( minor == MBEDTLS_SSL_MINOR_VERSION_2 )
            --minor; /* DTLS 1.0 stored as TLS 1.1 internally */

        ver[0] = (unsigned char)( 255 - ( major - 2 ) );
        ver[1] = (unsigned char)( 255 - ( minor - 1 ) );
    }
    else
#else
    ((void) transport);
#endif
    {
        ver[0] = (unsigned char) major;
        ver[1] = (unsigned char) minor;
    }
}